

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,int,duckdb::DefaultMapType<std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  long *plVar13;
  long lVar14;
  long lVar15;
  UnifiedVectorFormat sdata;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  long local_a8;
  Vector *local_a0;
  idx_t local_98;
  long local_90;
  long local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar7 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0;
    iVar10 = 0;
    do {
      iVar11 = iVar10;
      if (*local_78 != 0) {
        iVar11 = (idx_t)*(uint *)(*local_78 + iVar10 * 4);
      }
      lVar15 = **(long **)(local_70 + iVar11 * 8);
      if (lVar15 != 0) {
        lVar14 = lVar14 + *(long *)(lVar15 + 0x18);
      }
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
  }
  duckdb::ListVector::Reserve(result,lVar14 + uVar7);
  local_90 = duckdb::MapVector::GetKeys(result);
  lVar14 = duckdb::MapVector::GetValues(result);
  if (count != 0) {
    local_88 = local_70;
    lVar15 = *(long *)(result + 0x20);
    lVar14 = *(long *)(lVar14 + 0x20);
    local_a0 = result + 0x30;
    uVar12 = 0;
    local_a8 = lVar15;
    local_98 = offset;
    do {
      uVar8 = uVar12;
      if (*local_78 != 0) {
        uVar8 = (ulong)*(uint *)(*local_78 + uVar12 * 4);
      }
      uVar1 = uVar12 + offset;
      lVar3 = **(long **)(local_88 + uVar8 * 8);
      if (lVar3 == 0) {
        if (*(long *)(result + 0x28) == 0) {
          local_80 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var6 = p_Stack_b0;
          uVar5 = local_b8;
          local_b8 = 0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar5;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              local_a0);
          *(unsigned_long **)(result + 0x28) =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          lVar15 = local_a8;
        }
        bVar4 = (byte)uVar1 & 0x3f;
        puVar2 = (ulong *)(*(long *)(result + 0x28) + (uVar1 >> 6) * 8);
        *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        offset = local_98;
      }
      else {
        *(ulong *)(lVar15 + uVar1 * 0x10) = uVar7;
        plVar13 = *(long **)(lVar3 + 0x10);
        if (plVar13 != (long *)0x0) {
          lVar3 = *(long *)(local_90 + 0x20);
          do {
            *(int *)(lVar3 + uVar7 * 4) = (int)plVar13[1];
            *(long *)(lVar14 + uVar7 * 8) = plVar13[2];
            uVar7 = uVar7 + 1;
            plVar13 = (long *)*plVar13;
          } while (plVar13 != (long *)0x0);
        }
        plVar13 = (long *)(uVar1 * 0x10 + lVar15);
        plVar13[1] = uVar7 - *plVar13;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != count);
  }
  duckdb::ListVector::SetListSize(result,uVar7);
  duckdb::Vector::Verify((ulong)result);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}